

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CompactRepeatedFieldPrinter_Test::TestBody
          (TextFormatTest_CompactRepeatedFieldPrinter_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *field;
  FastFieldValuePrinter *printer_00;
  char *pcVar2;
  TestAllTypes_NestedMessage *pTVar3;
  char *in_R9;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar;
  AssertHelper local_468;
  Message local_460;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__1;
  string text;
  TestAllTypes message;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Printer printer;
  TextFormatTest_CompactRepeatedFieldPrinter_Test *this_local;
  
  TextFormat::Printer::Printer((Printer *)&gtest_ar_.message_);
  proto2_unittest::TestAllTypes::default_instance();
  this_00 = proto2_unittest::TestAllTypes::descriptor();
  field = Descriptor::FindFieldByNumber(this_00,0x30);
  printer_00 = (FastFieldValuePrinter *)operator_new(8);
  CompactRepeatedFieldPrinter::CompactRepeatedFieldPrinter
            ((CompactRepeatedFieldPrinter *)printer_00);
  local_91 = TextFormat::Printer::RegisterFieldValuePrinter
                       ((Printer *)&gtest_ar_.message_,field,printer_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,
               (AssertionResult *)
               "printer.RegisterFieldValuePrinter( unittest::TestAllTypes::default_instance() .descriptor() ->FindFieldByNumber( unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber), new CompactRepeatedFieldPrinter)"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x373,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (bVar1) {
    proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&text.field_2 + 8));
    pTVar3 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                       ((TestAllTypes *)((long)&text.field_2 + 8));
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar3,1);
    pTVar3 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                       ((TestAllTypes *)((long)&text.field_2 + 8));
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar3,2);
    pTVar3 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                       ((TestAllTypes *)((long)&text.field_2 + 8));
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar3,3);
    std::__cxx11::string::string((string *)&gtest_ar__1.message_);
    local_451 = TextFormat::Printer::PrintToString
                          ((Printer *)&gtest_ar_.message_,(Message *)((long)&text.field_2 + 8),
                           (string *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_450,&local_451,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
    if (!bVar1) {
      testing::Message::Message(&local_460);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_450,
                 (AssertionResult *)"printer.PrintToString(message, &text)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
                 ,0x37b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_468,&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_460);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
    if (bVar1) {
      testing::internal::EqHelper::
      Compare<char[53],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_498,
                 "\"repeated_nested_message {\\n\" \"  bb: 1\\n\" \"  bb: 2\\n\" \"  bb: 3\\n\" \"}\\n\""
                 ,"text",(char (*) [53])"repeated_nested_message {\n  bb: 1\n  bb: 2\n  bb: 3\n}\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar__1.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
      if (!bVar1) {
        testing::Message::Message(&local_4a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
                   ,0x382,pcVar2);
        testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        testing::Message::~Message(&local_4a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
    }
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&text.field_2 + 8));
  }
  TextFormat::Printer::~Printer((Printer *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(TextFormatTest, CompactRepeatedFieldPrinter) {
  TextFormat::Printer printer;
  ASSERT_TRUE(printer.RegisterFieldValuePrinter(
      unittest::TestAllTypes::default_instance()
          .descriptor()
          ->FindFieldByNumber(
              unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber),
      new CompactRepeatedFieldPrinter));

  proto2_unittest::TestAllTypes message;
  message.add_repeated_nested_message()->set_bb(1);
  message.add_repeated_nested_message()->set_bb(2);
  message.add_repeated_nested_message()->set_bb(3);

  std::string text;
  ASSERT_TRUE(printer.PrintToString(message, &text));
  EXPECT_EQ(
      "repeated_nested_message {\n"
      "  bb: 1\n"
      "  bb: 2\n"
      "  bb: 3\n"
      "}\n",
      text);
}